

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5HeapArgumentsObject::IsEnumerableByIndex(ES5HeapArgumentsObject *this,uint32 index)

{
  uint uVar1;
  int iVar2;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  JavascriptString *indexPropertyName;
  Var indexNumber;
  ScriptContext *scriptContext;
  ES5HeapArgumentsObject *pEStack_10;
  uint32 index_local;
  ES5HeapArgumentsObject *this_local;
  
  scriptContext._4_4_ = index;
  pEStack_10 = this;
  indexNumber = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  indexPropertyName =
       (JavascriptString *)
       JavascriptNumber::New((double)scriptContext._4_4_,(ScriptContext *)indexNumber);
  propertyRecord =
       (PropertyRecord *)
       JavascriptConversion::ToString(indexPropertyName,(ScriptContext *)indexNumber);
  ScriptContext::GetOrAddPropertyRecord
            ((ScriptContext *)indexNumber,(JavascriptString *)propertyRecord,&local_38);
  uVar1 = PropertyRecord::GetPropertyId(local_38);
  iVar2 = (*(this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x32])(this,(ulong)uVar1);
  return iVar2;
}

Assistant:

BOOL ES5HeapArgumentsObject::IsEnumerableByIndex(uint32 index)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        Var indexNumber = JavascriptNumber::New(index, scriptContext);
        JavascriptString* indexPropertyName = JavascriptConversion::ToString(indexNumber, scriptContext);
        PropertyRecord const * propertyRecord;
        scriptContext->GetOrAddPropertyRecord(indexPropertyName, &propertyRecord);
        return this->IsEnumerable(propertyRecord->GetPropertyId());
    }